

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O2

void __thiscall
OpenMD::SectionParserManager::parse(SectionParserManager *this,istream *input,ForceField *ff)

{
  bool bVar1;
  __type_conflict _Var2;
  int iVar3;
  _List_node_base *p_Var4;
  long *plVar5;
  _List_iterator<OpenMD::SectionParserContext> _Var6;
  _Elt_pointer pbVar7;
  char *__format;
  uint uVar8;
  SectionParserContextList *__last;
  undefined1 auVar9 [16];
  string section;
  string line;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sectionNameStack;
  string keyword;
  string sStack_100d0;
  string asStack_100b0 [32];
  StringTokenizer tokenizer;
  char buffer [65535];
  
  __last = &this->sectionParsers_;
  p_Var4 = (_List_node_base *)__last;
  while (p_Var4 = (((_List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)__last) {
    *(undefined1 *)&p_Var4[3]._M_prev = 0;
  }
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (&sectionNameStack);
  uVar8 = 1;
  do {
    plVar5 = (long *)std::istream::getline((char *)input,(long)buffer);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      p_Var4 = (_List_node_base *)__last;
      if (sectionNameStack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          sectionNameStack.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        memcpy(&painCave,
               "SectionParserManager Error: Stack is not empty.\n\tCheck for matching begin / end lines.\n"
               ,0x58);
        painCave.isFatal = 1;
        simError();
      }
      while (p_Var4 = (((_List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
                         *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var4 != (_List_node_base *)__last) {
        if (*(char *)&p_Var4[3]._M_prev == '\x01') {
          std::ios::clear((int)input->_vptr_basic_istream[-3] + (int)input);
          std::istream::seekg(input,p_Var4[2]._M_prev,p_Var4[3]._M_next);
          SectionParser::parse
                    ((SectionParser *)p_Var4[1]._M_prev,input,ff,*(int *)&p_Var4[2]._M_next);
          (*(code *)(p_Var4[1]._M_prev)->_M_next[1]._M_next)(p_Var4[1]._M_prev,ff);
        }
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&sectionNameStack.c);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_100d0,buffer,(allocator<char> *)&section);
    std::locale::locale((locale *)&keyword);
    Utils::trimLeftCopy(&tokenizer.tokenString_,&sStack_100d0,(locale *)&keyword);
    stripComments(&line,&tokenizer.tokenString_);
    std::__cxx11::string::~string((string *)&tokenizer);
    std::locale::~locale((locale *)&keyword);
    std::__cxx11::string::~string((string *)&sStack_100d0);
    if ((line._M_string_length != 0) &&
       (((line._M_string_length == 1 || (*line._M_dataplus._M_p != '/')) ||
        (line._M_dataplus._M_p[1] != '/')))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&keyword," ;\t\n\r",(allocator<char> *)&section);
      StringTokenizer::StringTokenizer(&tokenizer,&line,&keyword);
      std::__cxx11::string::~string((string *)&keyword);
      iVar3 = StringTokenizer::countTokens(&tokenizer);
      if (1 < iVar3) {
        StringTokenizer::nextToken_abi_cxx11_(&keyword,&tokenizer);
        bVar1 = std::operator==(&keyword,"begin");
        if (bVar1) {
          StringTokenizer::nextToken_abi_cxx11_(&section,&tokenizer);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&sectionNameStack.c,&section);
          _Var6._M_node =
               (__last->
               super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
               )._M_impl._M_node.super__List_node_base._M_next;
          std::__cxx11::string::string(asStack_100b0,(string *)&section);
          _Var6 = std::
                  find_if<std::_List_iterator<OpenMD::SectionParserContext>,OpenMD::SameSectionParserFunctor>
                            (_Var6,(_List_iterator<OpenMD::SectionParserContext>)__last,
                             (SameSectionParserFunctor *)asStack_100b0);
          std::__cxx11::string::~string(asStack_100b0);
          if (_Var6._M_node == (_List_node_base *)__last) {
            __format = 
            "SectionParserManager Error: Can not find corresponding section parser for %s\n";
LAB_001bbf69:
            snprintf(painCave.errMsg,2000,__format,section._M_dataplus._M_p);
            painCave.isFatal = 1;
            simError();
          }
          else {
            if (*(char *)&_Var6._M_node[3]._M_prev == '\x01') {
              __format = "SectionParserManager Error: Found multiple %s sections\n";
              goto LAB_001bbf69;
            }
            *(undefined1 *)&_Var6._M_node[3]._M_prev = 1;
            *(uint *)&_Var6._M_node[2]._M_next = uVar8;
            auVar9 = std::istream::tellg();
            *(undefined1 (*) [16])&_Var6._M_node[2]._M_prev = auVar9;
          }
          std::__cxx11::string::~string((string *)&section);
        }
        else {
          bVar1 = std::operator==(&keyword,"end");
          if (bVar1) {
            StringTokenizer::nextToken_abi_cxx11_(&section,&tokenizer);
            pbVar7 = sectionNameStack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (sectionNameStack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                sectionNameStack.c.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pbVar7 = sectionNameStack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
            }
            _Var2 = std::operator==(pbVar7 + -1,&section);
            if (_Var2) {
              std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(&sectionNameStack.c);
            }
            else {
              pbVar7 = sectionNameStack.c.
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (sectionNameStack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  sectionNameStack.c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pbVar7 = sectionNameStack.c.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
              }
              snprintf(painCave.errMsg,2000,
                       "SectionParserManager Error: begin %s and end %s do not match at line %d\n",
                       pbVar7[-1]._M_dataplus._M_p,section._M_dataplus._M_p,(ulong)uVar8);
              painCave.isFatal = 1;
              simError();
            }
            std::__cxx11::string::~string((string *)&section);
          }
        }
        std::__cxx11::string::~string((string *)&keyword);
      }
      StringTokenizer::~StringTokenizer(&tokenizer);
    }
    std::__cxx11::string::~string((string *)&line);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void SectionParserManager::parse(std::istream& input, ForceField& ff) {
    // reset active flags
    SectionParserManager::iterator i;
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      i->isActive = false;
    }

    const int bufferSize = 65535;
    char buffer[bufferSize];
    int lineNo = 0;
    std::stack<std::string> sectionNameStack;
    // scan through the input stream and find section names
    while (input.getline(buffer, bufferSize)) {
      ++lineNo;

      std::string line = stripComments(Utils::trimLeftCopy(buffer));
      // a line begins with "//" is a comment line
      if (line.empty() ||
          (line.size() >= 2 && line[0] == '/' && line[1] == '/')) {
        continue;
      } else {
        StringTokenizer tokenizer(line);
        if (tokenizer.countTokens() < 2) {
          continue;
        } else {
          std::string keyword = tokenizer.nextToken();

          if (keyword == "begin") {
            std::string section = tokenizer.nextToken();
            sectionNameStack.push(section);

            i = std::find_if(sectionParsers_.begin(), sectionParsers_.end(),
                             SameSectionParserFunctor(section));
            if (i == sectionParsers_.end()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: Can not find corresponding "
                       "section parser for %s\n",
                       section.c_str());
              painCave.isFatal = 1;
              simError();
            } else {
              if (i->isActive) {
                snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                         "SectionParserManager Error: Found multiple %s "
                         "sections\n",
                         section.c_str());
                painCave.isFatal = 1;
                simError();
              } else {
                i->isActive = true;
                i->lineNo   = lineNo;
                i->offset   = input.tellg();
              }
            }
          } else if (keyword == "end") {
            std::string section = tokenizer.nextToken();
            if (sectionNameStack.top() == section) {
              sectionNameStack.pop();
            } else {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "SectionParserManager Error: begin %s "
                       "and end %s do not match at line %d\n",
                       sectionNameStack.top().c_str(), section.c_str(), lineNo);
              painCave.isFatal = 1;
              simError();
            }
          } else {
            continue;
          }
        }
      }
    }

    if (!sectionNameStack.empty()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SectionParserManager Error: Stack is not empty.\n"
               "\tCheck for matching begin / end lines.\n");
      painCave.isFatal = 1;
      simError();
    }

    // invoke parser
    for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
      if (i->isActive) {
        // C++ standard does not guarantee seekg resets EOF, in that
        // case, seekg will fail. It is always a good idea to call
        // clear() before seek
        input.clear();
        input.seekg(i->offset);
        (i->sectionParser)->parse(input, ff, i->lineNo);
        (i->sectionParser)->validateSection(ff);
      }
    }
  }